

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O3

void __thiscall deqp::SubcaseBase::Documentation(SubcaseBase *this)

{
  TestLog *log;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  log = ((this->super_GLWrapper).m_context)->m_testCtx->m_log;
  (*(this->super_GLWrapper)._vptr_GLWrapper[5])(&local_38,this);
  WriteField(log,"Title",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_GLWrapper)._vptr_GLWrapper[6])(&local_58,this);
  WriteField(log,"Purpose",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_GLWrapper)._vptr_GLWrapper[7])(&local_78,this);
  WriteField(log,"Method",&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_GLWrapper)._vptr_GLWrapper[8])(&local_98,this);
  WriteField(log,"Pass Criteria",&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SubcaseBase::Documentation()
{
	using namespace std;
	using tcu::TestLog;
	TestLog& log = m_context.getTestContext().getLog();

	WriteField(log, "Title", Title());
	WriteField(log, "Purpose", Purpose());
	WriteField(log, "Method", Method());
	WriteField(log, "Pass Criteria", PassCriteria());

	//OpenGL fields
	string vsh = VertexShader();
	if (!vsh.empty())
		WriteField(log, "OpenGL vertex shader", vsh);

	string vsh2 = VertexShader2();
	if (!vsh2.empty())
		WriteField(log, "OpenGL vertex shader 2", vsh2);

	string tcsh = TessControlShader();
	if (!tcsh.empty())
		WriteField(log, "OpenGL tessellation control shader", tcsh);

	string tcsh2 = TessControlShader();
	if (!tcsh2.empty())
		WriteField(log, "OpenGL tessellation control shader 2", tcsh2);

	string tesh = TessControlShader();
	if (!tesh.empty())
		WriteField(log, "OpenGL tessellation evaluation shader", tesh);

	string tesh2 = TessControlShader();
	if (!tesh2.empty())
		WriteField(log, "OpenGL tessellation evaluation shader 2", tesh2);

	string gsh = GeometryShader();
	if (!gsh.empty())
		WriteField(log, "OpenGL geometry shader", gsh);

	string gsh2 = GeometryShader2();
	if (!gsh2.empty())
		WriteField(log, "OpenGL geometry shader 2", gsh2);

	string fsh = FragmentShader();
	if (!fsh.empty())
		WriteField(log, "OpenGL fragment shader", fsh);

	string fsh2 = FragmentShader2();
	if (!fsh2.empty())
		WriteField(log, "OpenGL fragment shader 2", fsh2);
}